

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cc
# Opt level: O1

void __thiscall p2t::Triangle::SetConstrainedEdgeCCW(Triangle *this,Point *p,bool ce)

{
  if (this->points_[0] == p) {
    this->constrained_edge[2] = ce;
    return;
  }
  if (this->points_[1] != p) {
    this->constrained_edge[1] = ce;
    return;
  }
  this->constrained_edge[0] = ce;
  return;
}

Assistant:

void Triangle::SetConstrainedEdgeCCW(const Point& p, bool ce)
{
  if (&p == points_[0]) {
    constrained_edge[2] = ce;
  } else if (&p == points_[1]) {
    constrained_edge[0] = ce;
  } else {
    constrained_edge[1] = ce;
  }
}